

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O1

Float pbrt::Checkerboard(TextureEvalContext ctx,TextureMapping2DHandle *map2D,
                        TextureMapping3DHandle *map3D)

{
  float fVar1;
  float fVar2;
  ulong uVar3;
  byte bVar4;
  anon_class_24_3_48d30edf func;
  TransformMapping3D *this;
  float fVar5;
  undefined1 auVar6 [64];
  undefined1 auVar8 [56];
  undefined1 auVar7 [64];
  undefined1 auVar10 [16];
  undefined1 auVar9 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar12 [60];
  undefined1 auVar11 [64];
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [12];
  undefined1 in_ZMM13 [64];
  undefined1 in_XMM16 [16];
  Point3f PVar27;
  undefined1 *local_90;
  ulong **ppuStack_88;
  Vector2f **local_80;
  Tuple2<pbrt::Vector2,_float> local_78;
  ulong local_70;
  Tuple2<pbrt::Vector2,_float> *local_68;
  ulong *local_60;
  undefined1 local_58 [24];
  Tuple3<pbrt::Vector3,_float> aTStack_40 [4];
  undefined1 extraout_var [56];
  
  this = (TransformMapping3D *)
         ((map3D->super_TaggedPointer<pbrt::TransformMapping3D>).bits & 0xffffffffffff);
  if (((map2D->
       super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
       ).bits & 0xffffffffffff) == 0) {
    if (this == (TransformMapping3D *)0x0) {
      LogFatal<char_const(&)[6]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/textures.cpp"
                 ,0xb9,"Check failed: %s",(char (*) [6])0x2c8fc8c);
    }
    local_58._0_8_ = 0;
    local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
    local_90 = (undefined1 *)0x0;
    ppuStack_88 = (ulong **)((ulong)ppuStack_88 & 0xffffffff00000000);
    auVar8 = ZEXT856((ulong)ctx._8_8_);
    auVar12 = ZEXT1260(in_ZMM1._4_12_);
    PVar27 = TransformMapping3D::Map(this,ctx,(Vector3f *)local_58,(Vector3f *)&local_90);
    auVar11._0_4_ = PVar27.super_Tuple3<pbrt::Point3,_float>.z;
    auVar11._4_60_ = auVar12;
    auVar7._0_8_ = PVar27.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar7._8_56_ = auVar8;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = local_58._0_8_;
    auVar19._8_4_ = 0x7fffffff;
    auVar19._0_8_ = 0x7fffffff7fffffff;
    auVar19._12_4_ = 0x7fffffff;
    auVar16 = vandps_avx(auVar16,auVar19);
    auVar18._8_8_ = 0;
    auVar18._0_8_ = local_90;
    auVar18 = vandps_avx(auVar18,auVar19);
    uVar3 = vcmpps_avx512vl(auVar16,auVar18,1);
    bVar4 = (byte)(uVar3 >> 1);
    auVar10 = vshufps_avx(auVar16,auVar16,0xf5);
    fVar13 = (float)((uint)((byte)uVar3 & 1) * auVar18._0_4_ +
                    (uint)!(bool)((byte)uVar3 & 1) * auVar16._0_4_) * 1.5;
    auVar16 = vshufps_avx(auVar18,auVar18,0xf5);
    fVar1 = (float)((uint)(bVar4 & 1) * auVar16._0_4_ + (uint)!(bool)(bVar4 & 1) * auVar10._0_4_) *
            1.5;
    auVar16 = vandps_avx(ZEXT416((uint)local_58._8_4_),auVar19);
    auVar18 = vandps_avx(ZEXT416((uint)ppuStack_88._0_4_),auVar19);
    auVar16 = vmaxss_avx(auVar18,auVar16);
    fVar5 = PVar27.super_Tuple3<pbrt::Point3,_float>.x;
    fVar20 = fVar5 - fVar13;
    auVar18 = vroundss_avx(ZEXT416((uint)fVar20),ZEXT416((uint)fVar20),9);
    fVar14 = fVar5 + fVar13;
    auVar10 = vroundss_avx(ZEXT416((uint)fVar14),ZEXT416((uint)fVar14),9);
    auVar19 = auVar7._0_16_;
    if ((auVar18._0_4_ != auVar10._0_4_) || (NAN(auVar18._0_4_) || NAN(auVar10._0_4_))) {
      fVar14 = fVar14 * 0.5;
      auVar18 = vroundss_avx(ZEXT416((uint)fVar14),ZEXT416((uint)fVar14),9);
      auVar25._8_4_ = 0x7fffffff;
      auVar25._0_8_ = 0x7fffffff7fffffff;
      auVar25._12_4_ = 0x7fffffff;
      auVar10 = ZEXT416((uint)((fVar14 - auVar18._0_4_) + -0.5));
      auVar18 = vandps_avx(auVar10,auVar25);
      auVar24 = SUB6416(ZEXT464(0x3f800000),0);
      auVar9 = SUB6416(ZEXT464(0xc0000000),0);
      auVar18 = vfmadd213ss_fma(auVar18,auVar9,auVar24);
      auVar10 = vfmadd213ss_fma(auVar18,auVar10,ZEXT416((uint)fVar14));
      fVar5 = fVar5 * 0.5;
      auVar18 = vroundss_avx(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5),9);
      auVar21 = ZEXT416((uint)((fVar5 - auVar18._0_4_) + -0.5));
      auVar18 = vandps_avx(auVar21,auVar25);
      auVar18 = vfmadd213ss_fma(auVar18,auVar9,auVar24);
      auVar18 = vfmadd213ss_fma(auVar18,auVar21,ZEXT416((uint)fVar5));
      auVar10 = vfmadd213ss_fma(auVar18,auVar9,auVar10);
      fVar20 = fVar20 * 0.5;
      auVar18 = vroundss_avx(ZEXT416((uint)fVar20),ZEXT416((uint)fVar20),9);
      auVar21 = ZEXT416((uint)((fVar20 - auVar18._0_4_) + -0.5));
      auVar18 = vandps_avx(auVar25,auVar21);
      auVar18 = vfmadd213ss_fma(auVar18,auVar9,auVar24);
      auVar18 = vfmadd213ss_fma(auVar18,auVar21,ZEXT416((uint)fVar20));
      fVar14 = (auVar18._0_4_ + auVar10._0_4_) / (fVar13 * fVar13);
    }
    else {
      auVar18 = vroundss_avx(auVar19,auVar19,9);
      fVar14 = (float)(int)(1 - ((int)auVar18._0_4_ * 2 & 2U));
    }
    fVar5 = auVar16._0_4_ * 1.5;
    auVar16 = vmovshdup_avx(auVar19);
    fVar20 = auVar16._0_4_;
    fVar2 = fVar20 - fVar1;
    auVar18 = vroundss_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2),9);
    fVar13 = fVar20 + fVar1;
    auVar10 = vroundss_avx(ZEXT416((uint)fVar13),ZEXT416((uint)fVar13),9);
    if ((auVar18._0_4_ != auVar10._0_4_) || (NAN(auVar18._0_4_) || NAN(auVar10._0_4_))) {
      fVar13 = fVar13 * 0.5;
      auVar16 = vroundss_avx(ZEXT416((uint)fVar13),ZEXT416((uint)fVar13),9);
      auVar21._8_4_ = 0x7fffffff;
      auVar21._0_8_ = 0x7fffffff7fffffff;
      auVar21._12_4_ = 0x7fffffff;
      auVar18 = ZEXT416((uint)((fVar13 - auVar16._0_4_) + -0.5));
      auVar16 = vandps_avx(auVar18,auVar21);
      auVar19 = SUB6416(ZEXT464(0x3f800000),0);
      auVar25 = SUB6416(ZEXT464(0xc0000000),0);
      auVar16 = vfmadd213ss_fma(auVar16,auVar25,auVar19);
      auVar18 = vfmadd213ss_fma(auVar16,auVar18,ZEXT416((uint)fVar13));
      fVar20 = fVar20 * 0.5;
      auVar16 = vroundss_avx(ZEXT416((uint)fVar20),ZEXT416((uint)fVar20),9);
      auVar10 = ZEXT416((uint)((fVar20 - auVar16._0_4_) + -0.5));
      auVar16 = vandps_avx(auVar21,auVar10);
      auVar16 = vfmadd213ss_fma(auVar16,auVar25,auVar19);
      auVar16 = vfmadd213ss_fma(auVar16,auVar10,ZEXT416((uint)fVar20));
      auVar18 = vfmadd213ss_fma(auVar16,auVar25,auVar18);
      fVar2 = fVar2 * 0.5;
      auVar16 = vroundss_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2),9);
      auVar10 = ZEXT416((uint)((fVar2 - auVar16._0_4_) + -0.5));
      auVar16 = vandps_avx(auVar21,auVar10);
      auVar16 = vfmadd213ss_fma(auVar16,auVar25,auVar19);
      auVar16 = vfmadd213ss_fma(auVar16,auVar10,ZEXT416((uint)fVar2));
      fVar13 = (auVar18._0_4_ + auVar16._0_4_) / (fVar1 * fVar1);
    }
    else {
      auVar16 = vroundss_avx(auVar16,auVar16,9);
      auVar16 = vcvtsi2ss_avx512f(in_XMM16,1 - ((int)auVar16._0_4_ * 2 & 2U));
      fVar13 = auVar16._0_4_;
    }
    fVar20 = auVar11._0_4_ - fVar5;
    auVar16 = vroundss_avx(ZEXT416((uint)fVar20),ZEXT416((uint)fVar20),9);
    fVar1 = auVar11._0_4_ + fVar5;
    auVar18 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
    if ((auVar16._0_4_ != auVar18._0_4_) || (NAN(auVar16._0_4_) || NAN(auVar18._0_4_))) {
      fVar1 = fVar1 * 0.5;
      auVar16 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
      auVar24._8_4_ = 0x7fffffff;
      auVar24._0_8_ = 0x7fffffff7fffffff;
      auVar24._12_4_ = 0x7fffffff;
      auVar18 = ZEXT416((uint)((fVar1 - auVar16._0_4_) + -0.5));
      auVar16 = vandps_avx(auVar24,auVar18);
      auVar19 = SUB6416(ZEXT464(0x3f800000),0);
      auVar21 = SUB6416(ZEXT464(0xc0000000),0);
      auVar16 = vfmadd213ss_fma(auVar16,auVar21,auVar19);
      auVar18 = vfmadd213ss_fma(auVar16,auVar18,ZEXT416((uint)fVar1));
      fVar1 = auVar11._0_4_ * 0.5;
      auVar16 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
      auVar10 = ZEXT416((uint)((fVar1 - auVar16._0_4_) + -0.5));
      auVar16 = vandps_avx(auVar24,auVar10);
      auVar16 = vfmadd213ss_fma(auVar16,auVar21,auVar19);
      auVar16 = vfmadd213ss_fma(auVar16,auVar10,ZEXT416((uint)fVar1));
      auVar18 = vfmadd213ss_fma(auVar16,auVar21,auVar18);
      fVar20 = fVar20 * 0.5;
      auVar16 = vroundss_avx(ZEXT416((uint)fVar20),ZEXT416((uint)fVar20),9);
      auVar10 = ZEXT416((uint)((fVar20 - auVar16._0_4_) + -0.5));
      auVar16 = vandps_avx(auVar24,auVar10);
      auVar16 = vfmadd213ss_fma(auVar16,auVar21,auVar19);
      auVar16 = vfmadd213ss_fma(auVar16,auVar10,ZEXT416((uint)fVar20));
      auVar10._0_4_ = (auVar16._0_4_ + auVar18._0_4_) / (fVar5 * fVar5);
      auVar10._4_12_ = SUB6012((undefined1  [60])0x0,0);
    }
    else {
      auVar16 = vroundss_avx(auVar11._0_16_,auVar11._0_16_,9);
      auVar10 = vcvtsi2ss_avx512f(in_XMM16,1 - ((int)auVar16._0_4_ * 2 & 2U));
    }
    fVar13 = fVar14 * -0.5 * fVar13;
  }
  else {
    if (this != (TransformMapping3D *)0x0) {
      LogFatal<char_const(&)[7]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/textures.cpp"
                 ,0xad,"Check failed: %s",(char (*) [7])"!map3D");
    }
    local_60 = &local_70;
    local_70 = 0;
    local_68 = &local_78;
    local_78.x = 0.0;
    local_78.y = 0.0;
    local_90 = local_58;
    local_58._0_4_ = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
    local_58._4_4_ = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
    local_58._8_4_ = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
    local_58._12_4_ = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
    local_58._16_4_ = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
    local_58._20_4_ = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
    aTStack_40[0].x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
    aTStack_40[0].y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
    aTStack_40[0].z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
    aTStack_40[1].x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
    aTStack_40[1].y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
    aTStack_40[1].z = ctx.dudx;
    aTStack_40[2].x = ctx.dudy;
    aTStack_40[2].y = ctx.dvdx;
    aTStack_40[2].z = ctx.dvdy;
    aTStack_40[3].x = (float)ctx.faceIndex;
    ppuStack_88 = &local_60;
    local_80 = (Vector2f **)&local_68;
    auVar26 = in_ZMM13._4_12_;
    func.dstdx = (Vector2f **)ppuStack_88;
    func.ctx = (TextureEvalContext *)local_90;
    func.dstdy = local_80;
    auVar6._0_8_ = TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
                   ::
                   Dispatch<pbrt::TextureMapping2DHandle::Map(pbrt::TextureEvalContext,pbrt::Vector2<float>*,pbrt::Vector2<float>*)const::_lambda(auto:1)_1_>
                             ((TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
                               *)map2D,func);
    auVar6._8_56_ = extraout_var;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_70;
    auVar15._8_4_ = 0x7fffffff;
    auVar15._0_8_ = 0x7fffffff7fffffff;
    auVar15._12_4_ = 0x7fffffff;
    auVar16 = vandps_avx(auVar9,auVar15);
    auVar17._8_8_ = 0;
    auVar17._0_4_ = local_78.x;
    auVar17._4_4_ = local_78.y;
    auVar18 = vandps_avx(auVar17,auVar15);
    uVar3 = vcmpps_avx512vl(auVar16,auVar18,1);
    bVar4 = (byte)(uVar3 >> 1);
    auVar10 = vshufps_avx(auVar16,auVar16,0xf5);
    auVar19 = vshufps_avx(auVar18,auVar18,0xf5);
    fVar13 = (float)((uint)((byte)uVar3 & 1) * auVar18._0_4_ +
                    (uint)!(bool)((byte)uVar3 & 1) * auVar16._0_4_) * 1.5;
    fVar1 = (float)((uint)(bVar4 & 1) * auVar19._0_4_ + (uint)!(bool)(bVar4 & 1) * auVar10._0_4_) *
            1.5;
    fVar5 = auVar6._0_4_;
    fVar20 = fVar5 - fVar13;
    auVar16 = vroundss_avx(ZEXT416((uint)fVar20),ZEXT416((uint)fVar20),9);
    fVar14 = fVar5 + fVar13;
    auVar18 = vroundss_avx(ZEXT416((uint)fVar14),ZEXT416((uint)fVar14),9);
    auVar10 = auVar6._0_16_;
    if ((auVar16._0_4_ != auVar18._0_4_) || (NAN(auVar16._0_4_) || NAN(auVar18._0_4_))) {
      fVar14 = fVar14 * 0.5;
      auVar16 = vroundss_avx(ZEXT416((uint)fVar14),ZEXT416((uint)fVar14),9);
      auVar22._8_4_ = 0x7fffffff;
      auVar22._0_8_ = 0x7fffffff7fffffff;
      auVar22._12_4_ = 0x7fffffff;
      auVar18 = ZEXT416((uint)((fVar14 - auVar16._0_4_) + -0.5));
      auVar16 = vandps_avx(auVar22,auVar18);
      auVar21 = SUB6416(ZEXT464(0x3f800000),0);
      auVar25 = SUB6416(ZEXT464(0xc0000000),0);
      auVar16 = vfmadd213ss_fma(auVar16,auVar25,auVar21);
      auVar18 = vfmadd213ss_fma(auVar16,auVar18,ZEXT416((uint)fVar14));
      fVar5 = fVar5 * 0.5;
      auVar16 = vroundss_avx(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5),9);
      auVar19 = ZEXT416((uint)((fVar5 - auVar16._0_4_) + -0.5));
      auVar16 = vandps_avx(auVar22,auVar19);
      auVar16 = vfmadd213ss_fma(auVar16,auVar25,auVar21);
      auVar16 = vfmadd213ss_fma(auVar16,auVar19,ZEXT416((uint)fVar5));
      auVar18 = vfmadd213ss_fma(auVar16,auVar25,auVar18);
      fVar20 = fVar20 * 0.5;
      auVar16 = vroundss_avx(ZEXT416((uint)fVar20),ZEXT416((uint)fVar20),9);
      auVar19 = ZEXT416((uint)((fVar20 - auVar16._0_4_) + -0.5));
      auVar16 = vandps_avx(auVar22,auVar19);
      auVar16 = vfmadd213ss_fma(auVar16,auVar25,auVar21);
      auVar16 = vfmadd213ss_fma(auVar16,auVar19,ZEXT416((uint)fVar20));
      fVar13 = (auVar18._0_4_ + auVar16._0_4_) / (fVar13 * fVar13);
    }
    else {
      auVar16 = vroundss_avx(auVar10,auVar10,9);
      fVar13 = (float)(int)(1 - ((int)auVar16._0_4_ * 2 & 2U));
    }
    auVar16 = vmovshdup_avx(auVar10);
    fVar5 = auVar16._0_4_;
    fVar20 = fVar5 - fVar1;
    auVar18 = vroundss_avx(ZEXT416((uint)fVar20),ZEXT416((uint)fVar20),9);
    fVar14 = fVar5 + fVar1;
    auVar10 = vroundss_avx(ZEXT416((uint)fVar14),ZEXT416((uint)fVar14),9);
    if ((auVar18._0_4_ != auVar10._0_4_) || (NAN(auVar18._0_4_) || NAN(auVar10._0_4_))) {
      fVar14 = fVar14 * 0.5;
      auVar16 = vroundss_avx(ZEXT416((uint)fVar14),ZEXT416((uint)fVar14),9);
      auVar23._8_4_ = 0x7fffffff;
      auVar23._0_8_ = 0x7fffffff7fffffff;
      auVar23._12_4_ = 0x7fffffff;
      auVar18 = ZEXT416((uint)((fVar14 - auVar16._0_4_) + -0.5));
      auVar16 = vandps_avx(auVar23,auVar18);
      auVar19 = SUB6416(ZEXT464(0x3f800000),0);
      auVar21 = SUB6416(ZEXT464(0xc0000000),0);
      auVar16 = vfmadd213ss_fma(auVar16,auVar21,auVar19);
      auVar18 = vfmadd213ss_fma(auVar16,auVar18,ZEXT416((uint)fVar14));
      fVar5 = fVar5 * 0.5;
      auVar16 = vroundss_avx(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5),9);
      auVar10 = ZEXT416((uint)((fVar5 - auVar16._0_4_) + -0.5));
      auVar16 = vandps_avx(auVar23,auVar10);
      auVar16 = vfmadd213ss_fma(auVar16,auVar21,auVar19);
      auVar16 = vfmadd213ss_fma(auVar16,auVar10,ZEXT416((uint)fVar5));
      auVar18 = vfmadd213ss_fma(auVar16,auVar21,auVar18);
      fVar20 = fVar20 * 0.5;
      auVar16 = vroundss_avx(ZEXT416((uint)fVar20),ZEXT416((uint)fVar20),9);
      auVar10 = ZEXT416((uint)((fVar20 - auVar16._0_4_) + -0.5));
      auVar16 = vandps_avx(auVar23,auVar10);
      auVar16 = vfmadd213ss_fma(auVar16,auVar21,auVar19);
      auVar16 = vfmadd213ss_fma(auVar16,auVar10,ZEXT416((uint)fVar20));
      auVar10 = ZEXT416((uint)((auVar16._0_4_ + auVar18._0_4_) / (fVar1 * fVar1)));
    }
    else {
      auVar16 = vroundss_avx(auVar16,auVar16,9);
      auVar10._0_4_ = (float)(int)(1 - ((int)auVar16._0_4_ * 2 & 2U));
      auVar10._4_12_ = auVar26;
    }
    fVar13 = fVar13 * -0.5;
  }
  auVar16 = vfmadd213ss_fma(ZEXT416((uint)fVar13),auVar10,ZEXT416(0x3f000000));
  return auVar16._0_4_;
}

Assistant:

Float Checkerboard(TextureEvalContext ctx, TextureMapping2DHandle map2D,
                   TextureMapping3DHandle map3D) {
    // Define 1D checkerboard filtered integral functions
    auto d = [](Float x) {
        Float y = x / 2 - std::floor(x / 2) - 0.5f;
        return x / 2 + y * (1 - 2 * std::abs(y));
    };

    auto bf = [&](Float x, Float w) -> Float {
        if (std::floor(x - w) == std::floor(x + w))
            return 1 - 2 * (int(std::floor(x)) & 1);
        return (d(x + w) - 2 * d(x) + d(x - w)) / Sqr(w);
    };

    if (map2D) {
        // Return weights for 2D checkerboard texture
        CHECK(!map3D);
        Vector2f dstdx, dstdy;
        Point2f st = map2D.Map(ctx, &dstdx, &dstdy);
        Float ds = std::max(std::abs(dstdx[0]), std::abs(dstdy[0]));
        Float dt = std::max(std::abs(dstdx[1]), std::abs(dstdy[1]));
        // Integrate product of 2D checkerboard function and triangle filter
        ds *= 1.5f;
        dt *= 1.5f;
        return 0.5f - 0.5f * bf(st[0], ds) * bf(st[1], dt);

    } else {
        // Return weights for 3D checkerboard texture
        CHECK(map3D);
        Vector3f dpdx, dpdy;
        Point3f p = map3D.Map(ctx, &dpdx, &dpdy);
        Float dx = 1.5f * std::max(std::abs(dpdx.x), std::abs(dpdy.x));
        Float dy = 1.5f * std::max(std::abs(dpdx.y), std::abs(dpdy.y));
        Float dz = 1.5f * std::max(std::abs(dpdx.z), std::abs(dpdy.z));
        return 0.5f - 0.5f * bf(p.x, dx) * bf(p.y, dy) * bf(p.z, dz);
    }
}